

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_string.c
# Opt level: O0

int parseAdvance(mpt_iterator *ptr)

{
  size_t __n;
  void *pvVar1;
  size_t len;
  char *next;
  mpt_parseIterator *it;
  mpt_iterator *ptr_local;
  
  if (ptr[6]._vptr == (_mpt_vptr_iterator *)0x0) {
    ptr_local._4_4_ = -0x10;
  }
  else if (ptr[5]._vptr == (_mpt_vptr_iterator *)0x0) {
    ptr[6]._vptr = (_mpt_vptr_iterator *)0x0;
    ptr_local._4_4_ = 0;
  }
  else {
    __n = (long)ptr[6]._vptr - (long)ptr[5]._vptr;
    if (__n == 0) {
      ptr[5]._vptr = (_mpt_vptr_iterator *)0x0;
      ptr[6]._vptr = (_mpt_vptr_iterator *)0x0;
      ptr_local._4_4_ = 0;
    }
    else {
      if (ptr[7]._vptr == (_mpt_vptr_iterator *)0x0) {
        pvVar1 = memchr(ptr[5]._vptr,0,__n);
        if (pvVar1 == (void *)0x0) {
          ptr[5]._vptr = (_mpt_vptr_iterator *)0x0;
          return 0;
        }
        ptr[5]._vptr = (_mpt_vptr_iterator *)((long)pvVar1 + 1);
      }
      else {
        ptr[5]._vptr = (_mpt_vptr_iterator *)((long)&(ptr[7]._vptr)->value + 1);
        *(undefined1 *)&(ptr[7]._vptr)->value = *(undefined1 *)&ptr[8]._vptr;
        ptr[7]._vptr = (_mpt_vptr_iterator *)0x0;
      }
      ptr_local._4_4_ = 0x73;
    }
  }
  return ptr_local._4_4_;
}

Assistant:

static int parseAdvance(MPT_INTERFACE(iterator) *ptr)
{
	MPT_STRUCT(parseIterator) *it = MPT_baseaddr(parseIterator, ptr, _it);
	char *next;
	size_t len;
	
	if (!it->end) {
		return MPT_ERROR(MissingData);
	}
	if (!it->val) {
		it->end = 0;
		return 0;
	}
	len = it->end - it->val;
	if (!(len = it->end - it->val)) {
		it->val = 0;
		it->end = 0;
		return 0;
	}
	if (it->restore) {
		it->val = it->restore + 1;
		*it->restore = it->save;
		it->restore = 0;
	}
	else if ((next = memchr(it->val, 0, len))) {
		it->val = next + 1;
	}
	else {
		it->val = 0;
		return 0;
	}
	return 's';
}